

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::LookupBucketFor<DBKeyID>
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DBKeyID *Val,DenseMapPair<DBKeyID,_llbuild::core::KeyID> **FoundBucket)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar9;
  int iVar10;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar11;
  
  if (*(int *)(this + 0x10) == 0) {
    *FoundBucket = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
    bVar5 = 0;
  }
  else {
    uVar1 = Val->value;
    if (0xfffffffffffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, LookupKeyT = DBKeyID]"
                   );
    }
    lVar2 = *(long *)this;
    iVar6 = (int)uVar1 * 9;
    uVar7 = *(int *)(this + 0x10) - 1;
    uVar8 = (int)uVar1 * 0x25 & uVar7;
    iVar10 = 1;
    pDVar9 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
    do {
      pDVar11 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)(lVar2 + (ulong)uVar8 * 0x10);
      uVar3 = *(ulong *)(lVar2 + (ulong)uVar8 * 0x10);
      if (uVar1 == uVar3) {
        *FoundBucket = pDVar11;
        iVar6 = 1;
        bVar4 = false;
      }
      else if (uVar3 == 0xffffffffffffffff) {
        if (pDVar9 != (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
          pDVar11 = pDVar9;
        }
        *FoundBucket = pDVar11;
        bVar4 = false;
        iVar6 = 0;
      }
      else {
        if (uVar3 == 0xfffffffffffffffe &&
            pDVar9 == (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
          pDVar9 = pDVar11;
        }
        uVar8 = uVar8 + iVar10;
        iVar10 = iVar10 + 1;
        uVar8 = uVar8 & uVar7;
        bVar4 = true;
      }
      bVar5 = (byte)iVar6;
    } while (bVar4);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }